

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void kj::_::Debug::
     log<char_const(&)[106],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [106],
               DebugComparison<unsigned_long,_unsigned_long> *params_1,unsigned_long *params_2,
               unsigned_long *params_3)

{
  undefined4 in_register_00000014;
  DebugComparison<unsigned_long,_unsigned_long> *params_00;
  unsigned_long *params_01;
  unsigned_long *params_02;
  ArrayPtr<kj::String> AVar1;
  ArrayPtr<kj::String> in_stack_fffffffffffffed8;
  ArrayDisposer **local_f0;
  undefined1 local_98 [8];
  String argValues [4];
  DebugComparison<unsigned_long,_unsigned_long> *params_local_1;
  char (*params_local) [106];
  char *macroArgs_local;
  LogSeverity severity_local;
  int line_local;
  char *file_local;
  
  str<char_const(&)[106]>
            ((String *)local_98,(kj *)params,(char (*) [106])CONCAT44(in_register_00000014,severity)
            );
  str<kj::_::DebugComparison<unsigned_long,unsigned_long>&>
            ((String *)&argValues[0].content.disposer,(kj *)params_1,params_00);
  str<unsigned_long&>((String *)&argValues[1].content.disposer,(kj *)params_2,params_01);
  str<unsigned_long&>((String *)&argValues[2].content.disposer,(kj *)params_3,params_02);
  AVar1 = arrayPtr<kj::String>((String *)local_98,4);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)AVar1.ptr,in_stack_fffffffffffffed8);
  local_f0 = &argValues[3].content.disposer;
  do {
    local_f0 = local_f0 + -3;
    String::~String((String *)local_f0);
  } while (local_f0 != (ArrayDisposer **)local_98);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}